

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.h
# Opt level: O2

string * __thiscall
cursespp::TextInput::GetText_abi_cxx11_(string *__return_storage_ptr__,TextInput *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->buffer);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetText() {
                return this->buffer;
            }